

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::ConfigureString
          (cmMakefile *this,string *input,string *output,bool atOnly,bool escapeQuotes)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  string indentation;
  string local_f8;
  cmMakefile *local_d8;
  string local_d0;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RegularExpression *local_48;
  string *local_40;
  RegularExpression *local_38;
  
  if (input->_M_string_length != 0) {
    pcVar8 = (input->_M_dataplus)._M_p;
    pcVar3 = pcVar8 + input->_M_string_length;
    local_38 = &this->cmDefineRegex;
    local_48 = &this->cmDefine01Regex;
    pcVar4 = pcVar8;
    local_d8 = this;
    local_40 = input;
LAB_0036957d:
    do {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      pcVar9 = pcVar8;
      if (*pcVar8 != '\n') {
        pcVar8 = pcVar8 + 1;
        pcVar9 = pcVar3;
        if (pcVar8 != pcVar3) goto LAB_0036957d;
      }
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&line,pcVar4,pcVar9);
      pcVar8 = (input->_M_dataplus)._M_p + input->_M_string_length;
      bVar2 = cmsys::RegularExpression::find(local_38,line._M_dataplus._M_p);
      pcVar1 = local_d8;
      if (bVar2) {
        pcVar4 = (local_d8->cmDefineRegex).startp[2];
        if (pcVar4 == (char *)0x0) {
          indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
          indentation._M_string_length = 0;
          indentation.field_2._M_local_buf[0] = '\0';
        }
        else {
          indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&indentation,pcVar4,(local_d8->cmDefineRegex).endp[2]);
        }
        pcVar4 = GetDefinition(pcVar1,&indentation);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)indentation._M_dataplus._M_p != &indentation.field_2) {
          operator_delete(indentation._M_dataplus._M_p,
                          CONCAT71(indentation.field_2._M_allocated_capacity._1_7_,
                                   indentation.field_2._M_local_buf[0]) + 1);
        }
        bVar2 = cmSystemTools::IsOff(pcVar4);
        if (bVar2) {
          std::__cxx11::string::append((char *)output);
          pcVar4 = (local_d8->cmDefineRegex).startp[2];
          if (pcVar4 == (char *)0x0) {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            indentation._M_string_length = 0;
            indentation.field_2._M_local_buf[0] = '\0';
          }
          else {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&indentation,pcVar4,(local_d8->cmDefineRegex).endp[2]);
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)indentation._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)indentation._M_dataplus._M_p != &indentation.field_2) {
            operator_delete(indentation._M_dataplus._M_p,
                            CONCAT71(indentation.field_2._M_allocated_capacity._1_7_,
                                     indentation.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::string::append((char *)output);
        }
        else {
          pcVar4 = (local_d8->cmDefineRegex).startp[1];
          if (pcVar4 == (char *)0x0) {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            indentation._M_string_length = 0;
            indentation.field_2._M_local_buf[0] = '\0';
          }
          else {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&indentation,pcVar4,(local_d8->cmDefineRegex).endp[1]);
          }
          std::operator+(&local_68,"#",&indentation);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          puVar6 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar6) {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_f8._M_string_length = plVar5[1];
          *plVar5 = (long)puVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::operator+(&local_88,"#",&indentation);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_d0.field_2._M_allocated_capacity = *psVar7;
            local_d0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar7;
            local_d0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_d0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          cmsys::SystemTools::ReplaceString(&line,&local_f8,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)line._M_dataplus._M_p);
LAB_00369b9e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)indentation._M_dataplus._M_p != &indentation.field_2) {
            operator_delete(indentation._M_dataplus._M_p,
                            CONCAT71(indentation.field_2._M_allocated_capacity._1_7_,
                                     indentation.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        bVar2 = cmsys::RegularExpression::find(local_48,line._M_dataplus._M_p);
        pcVar1 = local_d8;
        if (bVar2) {
          pcVar4 = (local_d8->cmDefine01Regex).startp[1];
          if (pcVar4 == (char *)0x0) {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            indentation._M_string_length = 0;
            indentation.field_2._M_local_buf[0] = '\0';
          }
          else {
            indentation._M_dataplus._M_p = (pointer)&indentation.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&indentation,pcVar4,(local_d8->cmDefine01Regex).endp[1]);
          }
          pcVar4 = (pcVar1->cmDefine01Regex).startp[2];
          if (pcVar4 == (char *)0x0) {
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_f8._M_string_length = 0;
            local_f8.field_2._M_allocated_capacity =
                 local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          }
          else {
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f8,pcVar4,(pcVar1->cmDefine01Regex).endp[2]);
          }
          pcVar4 = GetDefinition(pcVar1,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_68,"#",&indentation);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          puVar6 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar6) {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *puVar6;
            local_f8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_f8._M_string_length = plVar5[1];
          *plVar5 = (long)puVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::operator+(&local_88,"#",&indentation);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_d0.field_2._M_allocated_capacity = *psVar7;
            local_d0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar7;
            local_d0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_d0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          cmsys::SystemTools::ReplaceString(&line,&local_f8,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)line._M_dataplus._M_p);
          cmSystemTools::IsOff(pcVar4);
          std::__cxx11::string::append((char *)output);
          goto LAB_00369b9e;
        }
        std::__cxx11::string::_M_append((char *)output,(ulong)line._M_dataplus._M_p);
      }
      if (pcVar9 != pcVar8) {
        std::__cxx11::string::append((char *)output);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,line.field_2._M_allocated_capacity + 1);
      }
      pcVar8 = pcVar9 + (pcVar9 != pcVar8);
      pcVar3 = (local_40->_M_dataplus)._M_p + local_40->_M_string_length;
      input = local_40;
      pcVar4 = pcVar8;
      this = local_d8;
    } while (pcVar8 != pcVar3);
  }
  ExpandVariablesInString(this,output,escapeQuotes,true,atOnly,(char *)0x0,-1,true,true);
  return;
}

Assistant:

void cmMakefile::ConfigureString(const std::string& input, std::string& output,
                                 bool atOnly, bool escapeQuotes) const
{
  // Split input to handle one line at a time.
  std::string::const_iterator lineStart = input.begin();
  while (lineStart != input.end()) {
    // Find the end of this line.
    std::string::const_iterator lineEnd = lineStart;
    while (lineEnd != input.end() && *lineEnd != '\n') {
      ++lineEnd;
    }

    // Copy the line.
    std::string line(lineStart, lineEnd);

    // Skip the newline character.
    bool haveNewline = (lineEnd != input.end());
    if (haveNewline) {
      ++lineEnd;
    }

    // Replace #cmakedefine instances.
    if (this->cmDefineRegex.find(line)) {
      const char* def = this->GetDefinition(this->cmDefineRegex.match(2));
      if (!cmSystemTools::IsOff(def)) {
        const std::string indentation = this->cmDefineRegex.match(1);
        cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine",
                                     "#" + indentation + "define");
        output += line;
      } else {
        output += "/* #undef ";
        output += this->cmDefineRegex.match(2);
        output += " */";
      }
    } else if (this->cmDefine01Regex.find(line)) {
      const std::string indentation = this->cmDefine01Regex.match(1);
      const char* def = this->GetDefinition(this->cmDefine01Regex.match(2));
      cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine01",
                                   "#" + indentation + "define");
      output += line;
      if (!cmSystemTools::IsOff(def)) {
        output += " 1";
      } else {
        output += " 0";
      }
    } else {
      output += line;
    }

    if (haveNewline) {
      output += "\n";
    }

    // Move to the next line.
    lineStart = lineEnd;
  }

  // Perform variable replacements.
  this->ExpandVariablesInString(output, escapeQuotes, true, atOnly, CM_NULLPTR,
                                -1, true, true);
}